

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  
  if (ptr == end) {
    return -1;
  }
  iVar5 = 0;
  iVar6 = 0;
  if ((ptr[1] == '\0') && (iVar6 = iVar5, *ptr == '-')) {
    pbVar1 = (byte *)(ptr + 2);
joined_r0x004dee8e:
    pbVar4 = pbVar1;
    if (pbVar4 == (byte *)end) {
      return -1;
    }
    bVar2 = pbVar4[1];
    ptr = (char *)pbVar4;
    if (bVar2 < 0xdc) {
      if (bVar2 - 0xd8 < 4) {
switchD_004deefe_caseD_7:
        if ((long)end - (long)pbVar4 < 4) {
          return -2;
        }
        pbVar1 = pbVar4 + 4;
        goto joined_r0x004dee8e;
      }
      if (bVar2 != 0) goto switchD_004deefe_caseD_2;
      cVar3 = *(char *)((long)enc[1].scanners + (ulong)*pbVar4);
      switch(cVar3) {
      case '\0':
      case '\x01':
      case '\b':
        goto switchD_004deefe_caseD_0;
      case '\x02':
      case '\x03':
      case '\x04':
        break;
      case '\x05':
        if ((long)end - (long)pbVar4 < 2) {
          return -2;
        }
        break;
      case '\x06':
        if ((long)end - (long)pbVar4 < 3) {
          return -2;
        }
        pbVar1 = pbVar4 + 3;
        goto joined_r0x004dee8e;
      case '\a':
        goto switchD_004deefe_caseD_7;
      default:
        if (cVar3 != '\x1b') break;
        pbVar1 = pbVar4 + 2;
        if (pbVar1 == (byte *)end) {
          return -1;
        }
        if ((pbVar4[3] != 0) || (*pbVar1 != 0x2d)) goto joined_r0x004dee8e;
        ptr = (char *)(pbVar4 + 4);
        if (ptr == end) {
          return -1;
        }
        iVar6 = 0;
        if (pbVar4[5] == 0) {
          if (pbVar4[4] == 0x3e) {
            ptr = (char *)(pbVar4 + 6);
          }
          iVar6 = 0xd;
          if (pbVar4[4] != 0x3e) {
            iVar6 = 0;
          }
        }
        goto switchD_004deefe_caseD_0;
      }
    }
    else {
      if (bVar2 == 0xff) {
        if (*pbVar4 < 0xfe) goto switchD_004deefe_caseD_2;
        goto switchD_004deefe_caseD_0;
      }
      if (bVar2 - 0xdc < 4) goto switchD_004deefe_caseD_0;
    }
switchD_004deefe_caseD_2:
    pbVar1 = pbVar4 + 2;
    goto joined_r0x004dee8e;
  }
switchD_004deefe_caseD_0:
  *nextTokPtr = ptr;
  return iVar6;
}

Assistant:

static
int PREFIX(scanComment)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr != end) {
    if (!CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (ptr != end) {
      switch (BYTE_TYPE(enc, ptr)) {
      INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          if ((ptr += MINBPC(enc)) == end)
            return XML_TOK_PARTIAL;
          if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}